

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-chat.cpp
# Opt level: O3

string * trim(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  string *psVar2;
  long lVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  ulong uVar7;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar5 = str->_M_string_length;
  sVar6 = 0;
  uVar7 = sVar6;
  if (sVar5 != 0) {
    do {
      iVar4 = isspace((int)pcVar1[sVar6]);
      uVar7 = sVar6;
      if (iVar4 == 0) break;
      sVar6 = sVar6 + 1;
      uVar7 = sVar5;
    } while (sVar5 != sVar6);
  }
  do {
    if (sVar5 <= uVar7) break;
    lVar3 = sVar5 - 1;
    sVar5 = sVar5 - 1;
    iVar4 = isspace((int)pcVar1[lVar3]);
  } while (iVar4 != 0);
  psVar2 = (string *)std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return psVar2;
}

Assistant:

static std::string trim(const std::string & str) {
    size_t start = 0;
    size_t end = str.size();
    while (start < end && isspace(str[start])) {
        start += 1;
    }
    while (end > start && isspace(str[end - 1])) {
        end -= 1;
    }
    return str.substr(start, end - start);
}